

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void duckdb::HistogramBinFunction::
     Combine<duckdb::HistogramBinState<duckdb::string_t>,duckdb::HistogramBinFunction>
               (HistogramBinState<duckdb::string_t> *source,
               HistogramBinState<duckdb::string_t> *target,AggregateInputData *input_data)

{
  unsafe_vector<duckdb::string_t> *puVar1;
  unsafe_vector<duckdb::string_t> *puVar2;
  string_t *psVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  NotImplementedException *this;
  vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *this_00;
  unsafe_vector<idx_t> *puVar7;
  InternalException *this_01;
  long lVar8;
  long lVar9;
  string_t *r;
  string_t *this_02;
  bool bVar10;
  string local_50;
  
  puVar1 = source->bin_boundaries;
  if (puVar1 == (unsafe_vector<duckdb::string_t> *)0x0) {
    return;
  }
  puVar2 = target->bin_boundaries;
  if (puVar2 == (unsafe_vector<duckdb::string_t> *)0x0) {
    this_00 = (vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *)operator_new(0x18);
    (this_00->super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    target->bin_boundaries = (unsafe_vector<duckdb::string_t> *)this_00;
    puVar7 = (unsafe_vector<idx_t> *)operator_new(0x18);
    (puVar7->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (puVar7->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (puVar7->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    target->counts = puVar7;
    ::std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::operator=
              (this_00,&source->bin_boundaries->
                        super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)target->counts,
               &source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    return;
  }
  this_02 = (puVar2->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
            super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  psVar3 = (puVar2->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
           super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  r = (puVar1->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_start;
  if ((long)psVar3 - (long)this_02 ==
      (long)(puVar1->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
            super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)r) {
    bVar10 = this_02 == psVar3;
    if (bVar10) {
LAB_019a7a1b:
      if (bVar10) {
        puVar4 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar5 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar8 = (long)puVar5 - (long)puVar4;
        puVar6 = (source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (lVar8 != (long)(source->counts->
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar6) {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Histogram combine - bin boundaries are the same but counts are different","");
          InternalException::InternalException(this_01,&local_50);
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (puVar5 == puVar4) {
          return;
        }
        lVar8 = lVar8 >> 3;
        lVar9 = 0;
        do {
          puVar4[lVar9] = puVar4[lVar9] + puVar6[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
        return;
      }
    }
    else {
      bVar10 = string_t::operator==(this_02,r);
      if (bVar10) {
        do {
          this_02 = this_02 + 1;
          r = r + 1;
          bVar10 = this_02 == psVar3;
          if (bVar10) goto LAB_019a7a1b;
          bVar10 = string_t::operator==(this_02,r);
        } while (bVar10);
      }
    }
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Histogram - cannot combine histograms with different bin boundaries. Bin boundaries must be the same for all histograms within the same group"
             ,"");
  NotImplementedException::NotImplementedException(this,&local_50);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.bin_boundaries) {
			// nothing to combine
			return;
		}
		if (!target.bin_boundaries) {
			// target does not have bin boundaries - copy everything over
			target.bin_boundaries = new unsafe_vector<typename STATE::TYPE>();
			target.counts = new unsafe_vector<idx_t>();
			*target.bin_boundaries = *source.bin_boundaries;
			*target.counts = *source.counts;
		} else {
			// both source and target have bin boundaries
			if (*target.bin_boundaries != *source.bin_boundaries) {
				throw NotImplementedException(
				    "Histogram - cannot combine histograms with different bin boundaries. "
				    "Bin boundaries must be the same for all histograms within the same group");
			}
			if (target.counts->size() != source.counts->size()) {
				throw InternalException("Histogram combine - bin boundaries are the same but counts are different");
			}
			D_ASSERT(target.counts->size() == source.counts->size());
			for (idx_t bin_idx = 0; bin_idx < target.counts->size(); bin_idx++) {
				(*target.counts)[bin_idx] += (*source.counts)[bin_idx];
			}
		}
	}